

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_perfecthash_aggregate.cpp
# Opt level: O2

SinkCombineResultType __thiscall
duckdb::PhysicalPerfectHashAggregate::Combine
          (PhysicalPerfectHashAggregate *this,ExecutionContext *context,
          OperatorSinkCombineInput *input)

{
  pthread_mutex_t *__mutex;
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  pointer this_00;
  type other;
  
  pGVar1 = input->global_state;
  pLVar2 = input->local_state;
  __mutex = (pthread_mutex_t *)(pGVar1 + 1);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  this_00 = unique_ptr<duckdb::PerfectAggregateHashTable,_std::default_delete<duckdb::PerfectAggregateHashTable>,_true>
            ::operator->((unique_ptr<duckdb::PerfectAggregateHashTable,_std::default_delete<duckdb::PerfectAggregateHashTable>,_true>
                          *)&pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                             _M_mutex.__data.__list);
  other = unique_ptr<duckdb::PerfectAggregateHashTable,_std::default_delete<duckdb::PerfectAggregateHashTable>,_true>
          ::operator*((unique_ptr<duckdb::PerfectAggregateHashTable,_std::default_delete<duckdb::PerfectAggregateHashTable>,_true>
                       *)(pLVar2 + 1));
  PerfectAggregateHashTable::Combine(this_00,other);
  pthread_mutex_unlock(__mutex);
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalPerfectHashAggregate::Combine(ExecutionContext &context,
                                                            OperatorSinkCombineInput &input) const {
	auto &lstate = input.local_state.Cast<PerfectHashAggregateLocalState>();
	auto &gstate = input.global_state.Cast<PerfectHashAggregateGlobalState>();

	lock_guard<mutex> l(gstate.lock);
	gstate.ht->Combine(*lstate.ht);

	return SinkCombineResultType::FINISHED;
}